

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetNonlinConvCoef(ARKodeMem ark_mem,sunrealtype nlscoef)

{
  ARKodeMem in_XMM0_Qa;
  int retval;
  ARKodeMRIStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_XMM0_Qa,in_stack_ffffffffffffffe0,
                       (ARKodeMRIStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    if (0.0 < (double)in_XMM0_Qa) {
      *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0x100) = in_XMM0_Qa;
    }
    else {
      in_stack_ffffffffffffffe0[0x100] = -0x66;
      in_stack_ffffffffffffffe0[0x101] = -0x67;
      in_stack_ffffffffffffffe0[0x102] = -0x67;
      in_stack_ffffffffffffffe0[0x103] = -0x67;
      in_stack_ffffffffffffffe0[0x104] = -0x67;
      in_stack_ffffffffffffffe0[0x105] = -0x67;
      in_stack_ffffffffffffffe0[0x106] = -0x47;
      in_stack_ffffffffffffffe0[0x107] = '?';
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_SetNonlinConvCoef(ARKodeMem ark_mem, sunrealtype nlscoef)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* argument <= 0 sets default, otherwise set input */
  if (nlscoef <= ZERO) { step_mem->nlscoef = NLSCOEF; }
  else { step_mem->nlscoef = nlscoef; }

  return (ARK_SUCCESS);
}